

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O0

psa_status_t psa_crypto_storage_get_data_length(psa_key_file_id_t key,size_t *data_length)

{
  psa_storage_info_t local_30;
  psa_storage_info_t data_identifier_info;
  psa_storage_uid_t data_identifier;
  psa_status_t status;
  size_t *data_length_local;
  psa_key_file_id_t key_local;
  
  data_identifier_info = (psa_storage_info_t)psa_its_identifier_of_slot(key);
  data_length_local._4_4_ = psa_its_get_info((psa_storage_uid_t)data_identifier_info,&local_30);
  if (data_length_local._4_4_ == 0) {
    *data_length = (ulong)local_30.size;
    data_length_local._4_4_ = 0;
  }
  return data_length_local._4_4_;
}

Assistant:

static psa_status_t psa_crypto_storage_get_data_length(
    const psa_key_file_id_t key,
    size_t *data_length )
{
    psa_status_t status;
    psa_storage_uid_t data_identifier = psa_its_identifier_of_slot( key );
    struct psa_storage_info_t data_identifier_info;

    status = psa_its_get_info( data_identifier, &data_identifier_info );
    if( status != PSA_SUCCESS )
        return( status );

    *data_length = (size_t) data_identifier_info.size;

    return( PSA_SUCCESS );
}